

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O1

list * __thiscall DataGroup_PY::getNamedEntries_PY(list *__return_storage_ptr__,DataGroup_PY *this)

{
  pointer pcVar1;
  vector<DL::Data,_std::allocator<DL::Data>_> *__x;
  pointer pDVar2;
  vector_t<Data> l;
  Data v;
  vector<DL::Data,_std::allocator<DL::Data>_> local_108;
  undefined1 local_f0 [64];
  _Alloc_hider local_b0;
  char local_a0 [16];
  Data local_90;
  
  __x = (vector<DL::Data,_std::allocator<DL::Data>_> *)DL::DataGroup::getNamedEntries();
  std::vector<DL::Data,_std::allocator<DL::Data>_>::vector(&local_108,__x);
  boost::python::detail::list_base::list_base(&__return_storage_ptr__->super_list_base);
  if (local_108.super__Vector_base<DL::Data,_std::allocator<DL::Data>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_108.super__Vector_base<DL::Data,_std::allocator<DL::Data>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pDVar2 = local_108.super__Vector_base<DL::Data,_std::allocator<DL::Data>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      pcVar1 = (pDVar2->mKey)._M_dataplus._M_p;
      local_f0._0_8_ = local_f0 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_f0,pcVar1,pcVar1 + (pDVar2->mKey)._M_string_length);
      local_f0._32_4_ = pDVar2->mType;
      local_f0._36_4_ = *(undefined4 *)&pDVar2->field_0x24;
      local_f0._40_8_ = pDVar2->field_2;
      DL::DataGroup::DataGroup((DataGroup *)(local_f0 + 0x30),&pDVar2->mGroup);
      local_b0._M_p = local_a0;
      pcVar1 = (pDVar2->mString)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b0,pcVar1,pcVar1 + (pDVar2->mString)._M_string_length);
      Data_PY::Data_PY((Data_PY *)&local_90,(Data *)local_f0);
      boost::python::list::append<Data_PY>(__return_storage_ptr__,(Data_PY *)&local_90);
      DL::Data::~Data(&local_90);
      DL::Data::~Data((Data *)local_f0);
      pDVar2 = pDVar2 + 1;
    } while (pDVar2 != local_108.super__Vector_base<DL::Data,_std::allocator<DL::Data>_>._M_impl.
                       super__Vector_impl_data._M_finish);
  }
  std::vector<DL::Data,_std::allocator<DL::Data>_>::~vector(&local_108);
  return __return_storage_ptr__;
}

Assistant:

bpy::list getNamedEntries_PY() const
	{
		auto l = getNamedEntries();
		bpy::list pyl;
		for (auto v : l)
			pyl.append(Data_PY(v));
		return pyl;
	}